

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O2

void __thiscall
TPZFront<float>::STensorProductMTData::STensorProductMTData
          (STensorProductMTData *this,int nthreads,TPZFront<float> *frontMat)

{
  ulong uVar1;
  ulong uVar2;
  thread local_40;
  STensorProductThreadData *threadData;
  
  TPZSemaphore::TPZSemaphore(&this->fWorkDoneSem);
  *(undefined8 *)((long)&(this->fMutexWorkDoneCS).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fMutexWorkDoneCS).super___mutex_base._M_mutex + 8) = 0;
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->fWorkSem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_017b4f28;
  (this->fWorkSem).fStore = (TPZSemaphore *)0x0;
  (this->fWorkSem).fNElements = 0;
  (this->fWorkSem).fNAlloc = 0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fThreadData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_017b4f78;
  (this->fThreadData).fStore = (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0;
  (this->fThreadData).fNElements = 0;
  (this->fThreadData).fNAlloc = 0;
  if (frontMat == (TPZFront<float> *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFront.h"
               ,0xd9);
  }
  this->fMat = frontMat;
  this->fRunning = true;
  TPZVec<TPZSemaphore>::Resize(&this->fWorkSem,(long)nthreads);
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::Resize
            (&this->fThreadData,(long)nthreads);
  uVar1 = 0;
  uVar2 = (ulong)(uint)nthreads;
  if (nthreads < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    threadData = (STensorProductThreadData *)operator_new(0x10);
    threadData->first = (int)uVar1;
    threadData->second = this;
    (this->fThreadData).fStore[uVar1] = threadData;
    std::thread::
    thread<void*(&)(void*),std::pair<int,TPZFront<float>::STensorProductMTData*>*&,void>
              (&local_40,Execute,&threadData);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&this->fThreads,&local_40);
    std::thread::~thread(&local_40);
  }
  return;
}

Assistant:

STensorProductMTData(int nthreads, TPZFront<TVar> * frontMat){
			if(!frontMat) DebugStop();
			this->fMat = frontMat;
			this->fRunning = true;
			
			fWorkSem.Resize(nthreads);
			
      // threads must be initialised already with thread work
			// fThreads.resize(nthreads);
			fThreadData.Resize(nthreads);
			for(int i = 0; i < nthreads; i++){
				STensorProductThreadData * threadData = new STensorProductThreadData;
				threadData->first = i;
				threadData->second = this;
				fThreadData[i] = threadData;
        fThreads.push_back(std::thread(Execute, threadData));
			}
		}